

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

ostream * operator<<(ostream *stream,TokenType *token)

{
  ostream *poVar1;
  string tokenString;
  allocator<char> local_31;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             _ZL10TokenNames_rel + *(int *)(_ZL10TokenNames_rel + (ulong)*token * 4),&local_31);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const TokenType &token) {
    string tokenString = TokenNames[token];

    return stream << tokenString;
}